

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O0

uchar PrologEncoderMD::GetRequiredNodeCountForAlloca(size_t size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t size_local;
  
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,10,"(size)","size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((size & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0xb,"(size % 8 == 0)","size % 8 == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (size < 0x81) {
    size_local._7_1_ = '\x01';
  }
  else if (size < 0x7ff9) {
    size_local._7_1_ = '\x02';
  }
  else {
    size_local._7_1_ = '\x03';
  }
  return size_local._7_1_;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetRequiredNodeCountForAlloca(size_t size)
{
    Assert(size);
    Assert(size % 8 == 0);

    if (size <= 0x80)
        return 1;
    else if (size <= 0x7FF8)
        return 2;
    else
        return 3;
}